

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii.c
# Opt level: O1

int coda_ascii_reopen_with_definition(coda_product **product,coda_product_definition *definition)

{
  coda_product *pcVar1;
  coda_product *__ptr;
  char *pcVar2;
  int iVar3;
  
  if (definition == (coda_product_definition *)0x0) {
    __assert_fail("definition != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii.c"
                  ,0x34,
                  "int coda_ascii_reopen_with_definition(coda_product **, const coda_product_definition *)"
                 );
  }
  pcVar1 = *product;
  if (pcVar1->format == coda_format_binary) {
    if (definition->format == coda_format_ascii) {
      __ptr = (coda_product *)malloc(0x78);
      if (__ptr == (coda_product *)0x0) {
        iVar3 = -1;
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x78,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii.c"
                       ,0x3d);
      }
      else {
        iVar3 = 0;
        __ptr->filename = (char *)0x0;
        __ptr->file_size = pcVar1->file_size;
        __ptr->format = coda_format_ascii;
        __ptr->root_type = (coda_dynamic_type *)definition->root_type;
        __ptr->product_definition = definition;
        __ptr->product_variable_size = (long *)0x0;
        __ptr->product_variable = (int64_t **)0x0;
        __ptr->mem_size = pcVar1->mem_size;
        pcVar1->mem_size = 0;
        __ptr->mem_ptr = pcVar1->mem_ptr;
        pcVar1->mem_ptr = (uint8_t *)0x0;
        pcVar1 = *product;
        *(undefined4 *)&__ptr[1].filename = *(undefined4 *)&pcVar1[1].filename;
        *(undefined4 *)((long)&__ptr[1].filename + 4) =
             *(undefined4 *)((long)&pcVar1[1].filename + 4);
        *(undefined4 *)((long)&pcVar1[1].filename + 4) = 0xffffffff;
        *(undefined4 *)&__ptr[1].file_size = 0;
        *(undefined8 *)&__ptr[1].format = 0xffffffffffffffff;
        __ptr[1].root_type = (coda_dynamic_type *)0x0;
        *(undefined4 *)&__ptr[1].product_definition = 0;
        __ptr[1].product_variable_size = (long *)0x0;
        pcVar2 = strdup(pcVar1->filename);
        __ptr->filename = pcVar2;
        if (pcVar2 == (char *)0x0) {
          iVar3 = -1;
          coda_set_error(-1,"out of memory (could not duplicate filename string) (%s:%u)",
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii.c"
                         ,0x61);
          free(__ptr);
        }
        else {
          coda_close(pcVar1);
          *product = __ptr;
        }
      }
      return iVar3;
    }
    __assert_fail("definition->format == coda_format_ascii",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii.c"
                  ,0x36,
                  "int coda_ascii_reopen_with_definition(coda_product **, const coda_product_definition *)"
                 );
  }
  __assert_fail("(*product)->format == coda_format_binary",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii.c"
                ,0x35,
                "int coda_ascii_reopen_with_definition(coda_product **, const coda_product_definition *)"
               );
}

Assistant:

int coda_ascii_reopen_with_definition(coda_product **product, const coda_product_definition *definition)
{
    coda_ascii_product *product_file;

    assert(definition != NULL);
    assert((*product)->format == coda_format_binary);
    assert(definition->format == coda_format_ascii);

    /* copy information of binary raw product to new ascii product */
    product_file = (coda_ascii_product *)malloc(sizeof(coda_ascii_product));
    if (product_file == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       sizeof(coda_ascii_product), __FILE__, __LINE__);
        return -1;
    }
    product_file->filename = NULL;
    product_file->file_size = (*product)->file_size;
    product_file->format = definition->format;
    product_file->root_type = (coda_dynamic_type *)definition->root_type;
    product_file->product_definition = definition;
    product_file->product_variable_size = NULL;
    product_file->product_variable = NULL;
    product_file->mem_size = (*product)->mem_size;
    (*product)->mem_size = 0;
    product_file->mem_ptr = (*(coda_bin_product **)product)->mem_ptr;
    (*product)->mem_ptr = NULL;

    product_file->use_mmap = (*(coda_bin_product **)product)->use_mmap;
    product_file->fd = (*(coda_bin_product **)product)->fd;
    (*(coda_bin_product **)product)->fd = -1;

#ifdef WIN32
    product_file->file = (*(coda_bin_product **)product)->file;
    (*(coda_bin_product **)product)->file = INVALID_HANDLE_VALUE;
    product_file->file_mapping = (*(coda_bin_product **)product)->file_mapping;
    (*(coda_bin_product **)product)->file_mapping = INVALID_HANDLE_VALUE;
#endif

    product_file->end_of_line = eol_unknown;
    product_file->num_asciilines = -1;
    product_file->asciiline_end_offset = NULL;
    product_file->lastline_ending = eol_unknown;
    product_file->asciilines = NULL;

    product_file->filename = strdup((*product)->filename);
    if (product_file->filename == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate filename string) (%s:%u)",
                       __FILE__, __LINE__);
        free(product_file);
        return -1;
    }

    coda_close(*product);
    *product = (coda_product *)product_file;

    return 0;
}